

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

char duckdb::SignOperator::Operation<duckdb::uhugeint_t,signed_char>(uhugeint_t input)

{
  bool bVar1;
  byte bVar2;
  uhugeint_t uStack_38;
  uhugeint_t local_28;
  
  bVar2 = 0;
  uhugeint_t::uhugeint_t(&uStack_38,0);
  bVar1 = uhugeint_t::operator==(&local_28,&uStack_38);
  if (!bVar1) {
    uhugeint_t::uhugeint_t(&uStack_38,0);
    bVar1 = uhugeint_t::operator>(&local_28,&uStack_38);
    bVar2 = bVar1 - 1U | 1;
  }
  return bVar2;
}

Assistant:

static TR Operation(TA input) {
		if (input == TA(0)) {
			return 0;
		} else if (input > TA(0)) {
			return 1;
		} else {
			return -1;
		}
	}